

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SharedDtor(ConvolutionLayerParams *this)

{
  if (this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    if (this->weights_ != (WeightParams *)0x0) {
      (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->bias_ != (WeightParams *)0x0) {
      (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ConvolutionPaddingType(this);
    return;
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete weights_;
  }
  if (this != internal_default_instance()) {
    delete bias_;
  }
  if (has_ConvolutionPaddingType()) {
    clear_ConvolutionPaddingType();
  }
}